

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

CharReader * __thiscall Json::CharReaderBuilder::newCharReader(CharReaderBuilder *this)

{
  bool bVar1;
  bool bVar2;
  Value *pVVar3;
  CharReader *pCVar4;
  Value *this_00;
  OurFeatures local_28;
  
  this_00 = &this->settings_;
  pVVar3 = Value::operator[](this_00,"collectComments");
  bVar1 = Value::asBool(pVVar3);
  local_28.allowComments_ = false;
  local_28.strictRoot_ = false;
  local_28.allowDroppedNullPlaceholders_ = false;
  local_28.allowNumericKeys_ = false;
  local_28.allowSingleQuotes_ = false;
  local_28.failIfExtra_ = false;
  local_28.rejectDupKeys_ = false;
  local_28.allowSpecialFloats_ = false;
  local_28.stackLimit_ = 0;
  pVVar3 = Value::operator[](this_00,"allowComments");
  bVar2 = Value::asBool(pVVar3);
  local_28.allowComments_ = bVar2;
  pVVar3 = Value::operator[](this_00,"strictRoot");
  bVar2 = Value::asBool(pVVar3);
  local_28.strictRoot_ = bVar2;
  pVVar3 = Value::operator[](this_00,"allowDroppedNullPlaceholders");
  bVar2 = Value::asBool(pVVar3);
  local_28.allowDroppedNullPlaceholders_ = bVar2;
  pVVar3 = Value::operator[](this_00,"allowNumericKeys");
  bVar2 = Value::asBool(pVVar3);
  local_28.allowNumericKeys_ = bVar2;
  pVVar3 = Value::operator[](this_00,"allowSingleQuotes");
  bVar2 = Value::asBool(pVVar3);
  local_28.allowSingleQuotes_ = bVar2;
  pVVar3 = Value::operator[](this_00,"stackLimit");
  local_28.stackLimit_ = Value::asInt(pVVar3);
  pVVar3 = Value::operator[](this_00,"failIfExtra");
  bVar2 = Value::asBool(pVVar3);
  local_28.failIfExtra_ = bVar2;
  pVVar3 = Value::operator[](this_00,"rejectDupKeys");
  bVar2 = Value::asBool(pVVar3);
  local_28.rejectDupKeys_ = bVar2;
  pVVar3 = Value::operator[](this_00,"allowSpecialFloats");
  bVar2 = Value::asBool(pVVar3);
  local_28.allowSpecialFloats_ = bVar2;
  pCVar4 = (CharReader *)operator_new(0x128);
  pCVar4->_vptr_CharReader = (_func_int **)&PTR__OurCharReader_00124d58;
  *(bool *)&pCVar4[1]._vptr_CharReader = bVar1;
  OurReader::OurReader((OurReader *)(pCVar4 + 2),&local_28);
  return pCVar4;
}

Assistant:

CharReader* CharReaderBuilder::newCharReader() const
{
  bool collectComments = settings_["collectComments"].asBool();
  OurFeatures features = OurFeatures::all();
  features.allowComments_ = settings_["allowComments"].asBool();
  features.strictRoot_ = settings_["strictRoot"].asBool();
  features.allowDroppedNullPlaceholders_ = settings_["allowDroppedNullPlaceholders"].asBool();
  features.allowNumericKeys_ = settings_["allowNumericKeys"].asBool();
  features.allowSingleQuotes_ = settings_["allowSingleQuotes"].asBool();
  features.stackLimit_ = settings_["stackLimit"].asInt();
  features.failIfExtra_ = settings_["failIfExtra"].asBool();
  features.rejectDupKeys_ = settings_["rejectDupKeys"].asBool();
  features.allowSpecialFloats_ = settings_["allowSpecialFloats"].asBool();
  return new OurCharReader(collectComments, features);
}